

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O3

int __thiscall NetOptimize::fuse_deconvolutiondepthwise_batchnorm(NetOptimize *this)

{
  float fVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  pointer ppLVar4;
  Layer *pLVar5;
  long *plVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  size_type sVar13;
  void *__s;
  size_type __n;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  Mat local_a8;
  vector<float,_std::allocator<float>_> local_60;
  vector<float,_std::allocator<float>_> local_48;
  
  pvVar2 = (this->super_ModelWriter).layers;
  lVar15 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar15 != 0) {
    uVar16 = lVar15 >> 3;
    lVar15 = 0;
    do {
      iVar7 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar15]->type);
      if (iVar7 == 0) {
        uVar12 = lVar15 + 1;
        if (uVar12 < uVar16) {
          iVar7 = *((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar15]->tops).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          do {
            iVar8 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar12]->type);
            if (((iVar8 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar12],
                piVar10 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                (long)(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar10 == 4)) &&
               (*piVar10 == iVar7)) goto LAB_0013346c;
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar16);
        }
        else {
LAB_0013346c:
          if (uVar12 != uVar16) {
            ppLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar4[lVar15];
            pLVar5 = ppLVar4[uVar12];
            fprintf(_stderr,"fuse_deconvolutiondepthwise_batchnorm %s %s\n",
                    (pLVar3->name)._M_dataplus._M_p,(pLVar5->name)._M_dataplus._M_p);
            iVar7 = *(int *)&pLVar5[1]._vptr_Layer;
            __n = (size_type)iVar7;
            fVar1 = *(float *)((long)&pLVar5[1]._vptr_Layer + 4);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_48,__n,(allocator_type *)&local_a8);
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_60,__n,(allocator_type *)&local_a8);
            if (0 < iVar7) {
              sVar13 = 0;
              do {
                fVar17 = (float)pLVar5[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage[sVar13] + fVar1;
                if (fVar17 < 0.0) {
                  fVar17 = sqrtf(fVar17);
                }
                else {
                  fVar17 = SQRT(fVar17);
                }
                lVar11 = *(long *)&pLVar5[1].one_blob_only;
                local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[sVar13] =
                     *(float *)(*(long *)&pLVar5[2].support_tensor_storage + sVar13 * 4) -
                     (*(float *)(lVar11 + sVar13 * 4) *
                     *(float *)(pLVar5[1].name._M_dataplus._M_p + sVar13 * 4)) / fVar17;
                local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[sVar13] = *(float *)(lVar11 + sVar13 * 4) / fVar17;
                sVar13 = sVar13 + 1;
              } while (__n != sVar13);
            }
            if (*(int *)((long)&pLVar3[1].type._M_string_length + 4) == 0) {
              *(undefined4 *)((long)&pLVar3[1].type._M_string_length + 4) = 1;
              local_a8.cstep = 0;
              local_a8.data = (void *)0x0;
              local_a8.refcount._0_4_ = 0;
              local_a8.refcount._4_4_ = 0;
              local_a8.elemsize._0_4_ = 0;
              local_a8.elemsize._4_4_ = 0;
              local_a8.elempack = 0;
              local_a8.h = 0;
              local_a8.d = 0;
              local_a8.c = 0;
              local_a8.allocator = (Allocator *)0x0;
              local_a8.dims = 0;
              local_a8.w = 0;
              ncnn::Mat::create(&local_a8,iVar7,4,(Allocator *)0x0);
              piVar10 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
              if ((Mat *)&pLVar3[2].support_reserved_6 != &local_a8) {
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + 1;
                  UNLOCK();
                }
                piVar10 = (int *)pLVar3[2].userdata;
                if (piVar10 != (int *)0x0) {
                  LOCK();
                  *piVar10 = *piVar10 + -1;
                  UNLOCK();
                  if (*piVar10 == 0) {
                    plVar6 = (long *)pLVar3[2].type._M_string_length;
                    if (plVar6 == (long *)0x0) {
                      if (*(void **)&pLVar3[2].support_reserved_6 != (void *)0x0) {
                        free(*(void **)&pLVar3[2].support_reserved_6);
                      }
                    }
                    else {
                      (**(code **)(*plVar6 + 0x18))();
                    }
                  }
                }
                *(void **)&pLVar3[2].support_reserved_6 = local_a8.data;
                piVar10 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
                pLVar3[2].userdata = piVar10;
                *(ulong *)&pLVar3[2].typeindex =
                     CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
                *(int *)&pLVar3[2].type._M_dataplus._M_p = local_a8.elempack;
                pLVar3[2].type._M_string_length = (size_type)local_a8.allocator;
                *(int *)&pLVar3[2].type.field_2 = local_a8.dims;
                *(int *)((long)&pLVar3[2].type.field_2 + 4) = local_a8.w;
                *(int *)((long)&pLVar3[2].type.field_2 + 8) = local_a8.h;
                *(int *)((long)&pLVar3[2].type.field_2 + 0xc) = local_a8.d;
                *(int *)&pLVar3[2].name._M_dataplus._M_p = local_a8.c;
                pLVar3[2].name._M_string_length = local_a8.cstep;
              }
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_a8.allocator == (Allocator *)0x0) {
                    if (local_a8.data != (void *)0x0) {
                      free(local_a8.data);
                    }
                  }
                  else {
                    (*(local_a8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              uVar9 = *(int *)&pLVar3[2].name._M_dataplus._M_p *
                      (int)pLVar3[2].name._M_string_length;
              __s = *(void **)&pLVar3[2].support_reserved_6;
              if (0 < (int)uVar9) {
                memset(__s,0,(ulong)uVar9 << 2);
              }
            }
            else {
              __s = *(void **)&pLVar3[2].support_reserved_6;
            }
            if (0 < iVar7) {
              lVar11 = *(long *)&pLVar3[1].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data;
              uVar12 = (long)*(int *)&pLVar3[1].type.field_2 / (long)iVar7;
              iVar7 = (int)uVar12;
              sVar13 = 0;
              do {
                if (0 < iVar7) {
                  uVar14 = 0;
                  do {
                    *(float *)(lVar11 + uVar14 * 4) =
                         local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[sVar13] * *(float *)(lVar11 + uVar14 * 4);
                    uVar14 = uVar14 + 1;
                  } while ((uVar12 & 0xffffffff) != uVar14);
                }
                *(float *)((long)__s + sVar13 * 4) =
                     *(float *)((long)__s + sVar13 * 4) *
                     local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar13] +
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar13];
                sVar13 = sVar13 + 1;
                lVar11 = lVar11 + (long)iVar7 * 4;
              } while (sVar13 != __n);
            }
            if (local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            iVar7 = *(pLVar5->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar7;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar7].producer = (int)lVar15;
            std::__cxx11::string::_M_replace
                      ((ulong)&pLVar5->type,0,(char *)(pLVar5->type)._M_string_length,0x5b119a);
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != uVar16 + (uVar16 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::fuse_deconvolutiondepthwise_batchnorm()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "DeconvolutionDepthWise")
            continue;

        // DeconvolutionDepthWise - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse DeconvolutionDepthWise - BatchNorm to DeconvolutionDepthWise
        ncnn::DeconvolutionDepthWise* deconvolutiondepthwise = (ncnn::DeconvolutionDepthWise*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_deconvolutiondepthwise_batchnorm %s %s\n", deconvolutiondepthwise->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i = 0; i < channels; i++)
            {
                float sqrt_var = static_cast<float>(sqrt(batchnorm->var_data[i] + eps));
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (deconvolutiondepthwise->bias_term == 0)
            {
                // init bias as zero
                deconvolutiondepthwise->bias_term = 1;
                deconvolutiondepthwise->bias_data = ncnn::Mat(channels);
                deconvolutiondepthwise->bias_data.fill(0.f);
            }

            const int weight_per_outch = deconvolutiondepthwise->weight_data_size / channels;

            float* weight = deconvolutiondepthwise->weight_data;
            float* bias = deconvolutiondepthwise->bias_data;
            for (int i = 0; i < channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        deconvolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}